

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

__pid_t __thiscall kj::Promise<siginfo_t>::wait(Promise<siginfo_t> *this,void *__stat_loc)

{
  Own<kj::_::PromiseNode> *node;
  anon_struct_128_5_975a5653_for_value *paVar1;
  Exception *pEVar2;
  undefined8 in_RDX;
  Exception *exception_1;
  Exception *exception;
  anon_struct_128_5_975a5653_for_value *value;
  undefined1 local_200 [8];
  ExceptionOr<siginfo_t> result;
  WaitScope *waitScope_local;
  Promise<siginfo_t> *this_local;
  
  result.value.ptr.field_1._120_8_ = in_RDX;
  _::ExceptionOr<siginfo_t>::ExceptionOr((ExceptionOr<siginfo_t> *)local_200);
  node = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)__stat_loc);
  _::waitImpl(node,(ExceptionOrValue *)local_200,(WaitScope *)result.value.ptr.field_1._120_8_);
  paVar1 = _::readMaybe<siginfo_t>
                     ((Maybe<siginfo_t> *)
                      ((long)&result.super_ExceptionOrValue.exception.ptr.field_1 + 0x150));
  if (paVar1 != (anon_struct_128_5_975a5653_for_value *)0x0) {
    pEVar2 = _::readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_200);
    if (pEVar2 != (Exception *)0x0) {
      pEVar2 = mv<kj::Exception>(pEVar2);
      throwRecoverableException(pEVar2,0);
    }
    paVar1 = mv<siginfo_t>(paVar1);
    paVar1 = _::returnMaybeVoid<siginfo_t>(paVar1);
    memcpy(this,paVar1,0x80);
    _::ExceptionOr<siginfo_t>::~ExceptionOr((ExceptionOr<siginfo_t> *)local_200);
    return (__pid_t)this;
  }
  pEVar2 = _::readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_200);
  if (pEVar2 != (Exception *)0x0) {
    pEVar2 = mv<kj::Exception>(pEVar2);
    throwFatalException(pEVar2,0);
  }
  _::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }